

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModelCreationUtils.cpp
# Opt level: O1

NeuralNetworkClassifier *
buildBasicNeuralNetworkClassifierModel
          (Model *m,bool isUpdatable,TensorAttributes *inTensorAttr,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *stringClassLabels,vector<long,_std::allocator<long>_> *intClassLabels,bool includeBias)

{
  RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *this;
  RepeatedField<float> *pRVar1;
  pointer pcVar2;
  int iVar3;
  pointer pbVar4;
  pointer pbVar5;
  pointer pbVar6;
  pointer pcVar7;
  ConvolutionLayerParams *pCVar8;
  Rep *pRVar9;
  Rep *pRVar10;
  string *psVar11;
  size_t __n;
  Model *pMVar12;
  undefined4 uVar13;
  TensorAttributes *pTVar14;
  int iVar15;
  ModelDescription *pMVar16;
  Type *pTVar17;
  FeatureType *pFVar18;
  ArrayFeatureType *pAVar19;
  StringFeatureType *pSVar20;
  DictionaryFeatureType *pDVar21;
  NeuralNetworkClassifier *pNVar22;
  StringVector *this_00;
  Type *pTVar23;
  InnerProductLayerParams *this_01;
  WeightParams *pWVar24;
  LogMessage *pLVar25;
  SoftmaxLayerParams *this_02;
  Int64Vector *pIVar26;
  ModelDescription *pMVar27;
  long lVar28;
  void **ppvVar29;
  pointer pbVar30;
  long lVar31;
  undefined7 in_register_00000031;
  undefined7 in_register_00000089;
  int iVar32;
  int new_size;
  long lVar33;
  long lVar34;
  long lVar35;
  initializer_list<long> __l;
  vector<long,_std::allocator<long>_> *__range2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> className;
  FeatureDescription feature;
  allocator_type local_1a2;
  less<long> local_1a1;
  ConvolutionLayerParams *local_1a0;
  undefined4 local_194;
  undefined1 local_190 [56];
  Model *local_158;
  undefined4 local_14c;
  undefined1 local_148 [56];
  Type *local_110;
  RepeatedPtrFieldBase *local_108;
  TensorAttributes *local_100;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_f8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_c8;
  _Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_> local_98;
  LogMessage local_68;
  
  local_194 = (undefined4)CONCAT71(in_register_00000089,includeBias);
  pbVar4 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (stringClassLabels->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  local_1a0 = (ConvolutionLayerParams *)intClassLabels;
  if (m->description_ == (ModelDescription *)0x0) {
    pMVar16 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
    m->description_ = pMVar16;
  }
  local_158 = m;
  pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(m->description_->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar18 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar18);
  if (pFVar18->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar18);
    pFVar18->_oneof_case_[0] = 5;
    pAVar19 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar19);
    (pFVar18->Type_).multiarraytype_ = pAVar19;
  }
  pAVar19 = (pFVar18->Type_).multiarraytype_;
  iVar15 = inTensorAttr->dimension;
  iVar32 = (pAVar19->shape_).total_size_;
  if ((pAVar19->shape_).current_size_ == iVar32) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar19->shape_,iVar32 + 1);
  }
  iVar32 = (pAVar19->shape_).current_size_;
  (pAVar19->shape_).current_size_ = iVar32 + 1;
  ((pAVar19->shape_).rep_)->elements[iVar32] = (long)iVar15;
  pAVar19->datatype_ = 0x10040;
  CoreML::Specification::FeatureDescription::set_name(pTVar17,inTensorAttr->name);
  if (pTVar17->type_ != (FeatureType *)0x0) {
    (*(pTVar17->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pMVar12 = local_158;
  pTVar17->type_ = pFVar18;
  if (local_158->description_ == (ModelDescription *)0x0) {
    pMVar16 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
    pMVar12->description_ = pMVar16;
  }
  pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(pMVar12->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar18 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar18);
  local_100 = inTensorAttr;
  if (pbVar5 == pbVar4) {
    if (pFVar18->_oneof_case_[0] != 1) {
      CoreML::Specification::FeatureType::clear_Type(pFVar18);
      pFVar18->_oneof_case_[0] = 1;
      pSVar20 = (StringFeatureType *)operator_new(0x18);
      CoreML::Specification::Int64FeatureType::Int64FeatureType((Int64FeatureType *)pSVar20);
      goto LAB_001d68e1;
    }
  }
  else if (pFVar18->_oneof_case_[0] != 3) {
    CoreML::Specification::FeatureType::clear_Type(pFVar18);
    pFVar18->_oneof_case_[0] = 3;
    pSVar20 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar20);
LAB_001d68e1:
    (pFVar18->Type_).stringtype_ = pSVar20;
  }
  local_14c = (undefined4)CONCAT71(in_register_00000031,isUpdatable);
  pcVar2 = local_190 + 0x10;
  local_190._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"predictedClass","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar17->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_190);
  if ((pointer)local_190._0_8_ != pcVar2) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (pTVar17->type_ != (FeatureType *)0x0) {
    (*(pTVar17->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pMVar12 = local_158;
  pTVar17->type_ = pFVar18;
  if (local_158->description_ == (ModelDescription *)0x0) {
    pMVar16 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
    pMVar12->description_ = pMVar16;
  }
  pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                      (&(pMVar12->description_->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pFVar18 = (FeatureType *)operator_new(0x28);
  CoreML::Specification::FeatureType::FeatureType(pFVar18);
  if (pFVar18->_oneof_case_[0] != 6) {
    CoreML::Specification::FeatureType::clear_Type(pFVar18);
    pFVar18->_oneof_case_[0] = 6;
    pDVar21 = (DictionaryFeatureType *)operator_new(0x20);
    CoreML::Specification::DictionaryFeatureType::DictionaryFeatureType(pDVar21);
    (pFVar18->Type_).dictionarytype_ = pDVar21;
  }
  pDVar21 = (pFVar18->Type_).dictionarytype_;
  if (pbVar5 == pbVar4) {
    if (pDVar21->_oneof_case_[0] == 1) goto LAB_001d6a31;
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar21);
    pDVar21->_oneof_case_[0] = 1;
    pSVar20 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::Int64FeatureType::Int64FeatureType((Int64FeatureType *)pSVar20);
  }
  else {
    if (pDVar21->_oneof_case_[0] == 2) goto LAB_001d6a31;
    CoreML::Specification::DictionaryFeatureType::clear_KeyType(pDVar21);
    pDVar21->_oneof_case_[0] = 2;
    pSVar20 = (StringFeatureType *)operator_new(0x18);
    CoreML::Specification::StringFeatureType::StringFeatureType(pSVar20);
  }
  (pDVar21->KeyType_).stringkeytype_ = pSVar20;
LAB_001d6a31:
  local_190._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"classProbabilities","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar17->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_190);
  if ((pointer)local_190._0_8_ != pcVar2) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (pTVar17->type_ != (FeatureType *)0x0) {
    (*(pTVar17->type_->super_MessageLite)._vptr_MessageLite[1])();
  }
  pMVar12 = local_158;
  pTVar17->type_ = pFVar18;
  if (local_158->description_ == (ModelDescription *)0x0) {
    pMVar16 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
    pMVar12->description_ = pMVar16;
  }
  pMVar16 = pMVar12->description_;
  local_190._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"predictedClass","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar16->predictedfeaturename_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_190);
  if ((pointer)local_190._0_8_ != pcVar2) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (pMVar12->description_ == (ModelDescription *)0x0) {
    pMVar16 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
    pMVar12->description_ = pMVar16;
  }
  pMVar16 = pMVar12->description_;
  local_190._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"classProbabilities","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pMVar16->predictedprobabilitiesname_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_190);
  if ((pointer)local_190._0_8_ != pcVar2) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  if (pMVar12->_oneof_case_[0] != 0x193) {
    CoreML::Specification::Model::clear_Type(pMVar12);
    pMVar12->_oneof_case_[0] = 0x193;
    pNVar22 = (NeuralNetworkClassifier *)operator_new(0x68);
    CoreML::Specification::NeuralNetworkClassifier::NeuralNetworkClassifier(pNVar22);
    (pMVar12->Type_).neuralnetworkclassifier_ = pNVar22;
  }
  pNVar22 = (pMVar12->Type_).neuralnetworkclassifier_;
  if (pbVar5 == pbVar4) {
    pbVar6 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_1a0->super_MessageLite)->_M_impl).super__Vector_impl_data._M_finish;
    for (pbVar30 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_1a0->super_MessageLite)->_M_impl).super__Vector_impl_data._M_start;
        pbVar30 != pbVar6; pbVar30 = (pointer)&pbVar30->_M_string_length) {
      pcVar7 = (pbVar30->_M_dataplus)._M_p;
      if (pNVar22->_oneof_case_[0] != 0x65) {
        CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar22);
        pNVar22->_oneof_case_[0] = 0x65;
        pIVar26 = (Int64Vector *)operator_new(0x28);
        CoreML::Specification::Int64Vector::Int64Vector(pIVar26);
        (pNVar22->ClassLabels_).int64classlabels_ = pIVar26;
      }
      pIVar26 = (pNVar22->ClassLabels_).int64classlabels_;
      iVar15 = (pIVar26->vector_).total_size_;
      if ((pIVar26->vector_).current_size_ == iVar15) {
        google::protobuf::RepeatedField<long>::Reserve(&pIVar26->vector_,iVar15 + 1);
      }
      iVar15 = (pIVar26->vector_).current_size_;
      (pIVar26->vector_).current_size_ = iVar15 + 1;
      ((pIVar26->vector_).rep_)->elements[iVar15] = (long)pcVar7;
    }
  }
  else {
    pbVar30 = (stringClassLabels->
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              )._M_impl.super__Vector_impl_data._M_start;
    pbVar6 = (stringClassLabels->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    if (pbVar30 != pbVar6) {
      do {
        pcVar7 = (pbVar30->_M_dataplus)._M_p;
        local_190._0_8_ = pcVar2;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)local_190,pcVar7,pcVar7 + pbVar30->_M_string_length);
        if (pNVar22->_oneof_case_[0] != 100) {
          CoreML::Specification::NeuralNetworkClassifier::clear_ClassLabels(pNVar22);
          pNVar22->_oneof_case_[0] = 100;
          this_00 = (StringVector *)operator_new(0x30);
          CoreML::Specification::StringVector::StringVector(this_00);
          (pNVar22->ClassLabels_).stringclasslabels_ = this_00;
        }
        CoreML::Specification::StringVector::add_vector
                  ((pNVar22->ClassLabels_).stringclasslabels_,(string *)local_190);
        if ((pointer)local_190._0_8_ != pcVar2) {
          operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
        }
        pbVar30 = pbVar30 + 1;
      } while (pbVar30 != pbVar6);
    }
  }
  this = &pNVar22->layers_;
  pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (&this->super_RepeatedPtrFieldBase,(Type *)0x0);
  local_190._0_8_ = pcVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"inner_product","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar23->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_190);
  pTVar14 = local_100;
  local_108 = &this->super_RepeatedPtrFieldBase;
  if ((pointer)local_190._0_8_ != pcVar2) {
    operator_delete((void *)local_190._0_8_,local_190._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar23,pTVar14->name);
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar23,"intermediateOutput");
  if (pbVar5 == pbVar4) {
    stringClassLabels =
         (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)local_1a0;
  }
  pbVar30 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&((vector<long,_std::allocator<long>_> *)stringClassLabels)->
                  super__Vector_base<long,_std::allocator<long>_>)->_M_impl).super__Vector_impl_data
            ._M_start;
  pbVar6 = (((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&((vector<long,_std::allocator<long>_> *)stringClassLabels)->
                 super__Vector_base<long,_std::allocator<long>_>)->_M_impl).super__Vector_impl_data.
           _M_finish;
  lVar33 = (long)pbVar6 - (long)pbVar30 >> (pbVar5 != pbVar4) * '\x02' + 3;
  iVar15 = pTVar14->dimension;
  lVar31 = (long)iVar15;
  if (pTVar23->_oneof_case_[0] != 0x8c) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar23);
    pTVar23->_oneof_case_[0] = 0x8c;
    this_01 = (InnerProductLayerParams *)operator_new(0x38);
    CoreML::Specification::InnerProductLayerParams::InnerProductLayerParams(this_01);
    (pTVar23->layer_).innerproduct_ = this_01;
  }
  pCVar8 = (pTVar23->layer_).convolution_;
  *(long *)&pCVar8->_kernelsize_cached_byte_size_ = lVar31;
  (pCVar8->stride_).current_size_ = (int)lVar33;
  (pCVar8->stride_).total_size_ = (int)((ulong)lVar33 >> 0x20);
  lVar28._0_4_ = (pCVar8->kernelsize_).current_size_;
  lVar28._4_4_ = (pCVar8->kernelsize_).total_size_;
  if (lVar28 == 0) {
    pWVar24 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar24);
    *(WeightParams **)&pCVar8->kernelsize_ = pWVar24;
  }
  lVar28 = *(long *)&pCVar8->kernelsize_;
  new_size = (int)lVar33;
  iVar32 = (int)(new_size * lVar31);
  local_110 = pTVar23;
  if (iVar32 < 0) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x466);
    pLVar25 = google::protobuf::internal::LogMessage::operator<<
                        (&local_68,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_190,pLVar25);
    google::protobuf::internal::LogMessage::~LogMessage(&local_68);
  }
  pRVar1 = (RepeatedField<float> *)(lVar28 + 0x10);
  local_1a0 = pCVar8;
  if (pRVar1->current_size_ < iVar32) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar32);
    iVar3 = pRVar1->current_size_;
    if (iVar3 != iVar32) {
      memset((void *)(*(long *)(lVar28 + 0x18) + (long)iVar3 * 4 + 8),0,
             new_size * lVar31 * 4 + (long)iVar3 * -4);
    }
  }
  *(int *)(lVar28 + 0x10) = iVar32;
  lVar34 = *(long *)(lVar28 + 0x18) + 8;
  if (*(long *)(lVar28 + 0x18) == 0) {
    lVar34 = 0;
  }
  if (iVar15 != 0) {
    lVar28 = 0;
    do {
      if (pbVar6 != pbVar30) {
        lVar35 = 0;
        do {
          iVar15 = rand();
          *(float *)(lVar34 + lVar35 * 4) = (float)iVar15 * 4.656613e-10;
          lVar35 = lVar35 + 1;
        } while (lVar33 != lVar35);
      }
      lVar28 = lVar28 + 1;
      lVar34 = lVar34 + lVar33 * 4;
    } while (lVar28 != lVar31);
  }
  pMVar12 = local_158;
  pCVar8 = local_1a0;
  if ((char)local_194 != '\0') {
    *(undefined1 *)&(local_1a0->stride_).rep_ = 1;
    if ((local_1a0->kernelsize_).rep_ == (Rep *)0x0) {
      pWVar24 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar24);
      (pCVar8->kernelsize_).rep_ = (Rep *)pWVar24;
    }
    pRVar9 = (pCVar8->kernelsize_).rep_;
    if (new_size < 0) {
      google::protobuf::internal::LogMessage::LogMessage
                ((LogMessage *)local_190,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/hollance[P]coremltools/mlmodel/../deps/protobuf/src/google/protobuf/repeated_field.h"
                 ,0x466);
      pLVar25 = google::protobuf::internal::LogMessage::operator<<
                          ((LogMessage *)local_190,"CHECK failed: (new_size) >= (0): ");
      google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_148,pLVar25);
      google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_190);
    }
    pRVar1 = (RepeatedField<float> *)(pRVar9 + 1);
    if (pRVar1->current_size_ < new_size) {
      google::protobuf::RepeatedField<float>::Reserve(pRVar1,new_size);
      iVar15 = pRVar1->current_size_;
      if (iVar15 != new_size) {
        memset((void *)(pRVar9[1].elements[0] + (long)iVar15 * 4 + 8),0,
               (long)new_size * 4 + (long)iVar15 * -4);
      }
    }
    *(int *)&pRVar9[1].arena = new_size;
    lVar31 = pRVar9[1].elements[0] + 8;
    if (pRVar9[1].elements[0] == 0) {
      lVar31 = 0;
    }
    if (pbVar6 != pbVar30) {
      lVar28 = 0;
      do {
        iVar15 = rand();
        *(float *)(lVar31 + lVar28 * 4) = (float)iVar15 * 4.656613e-10;
        lVar28 = lVar28 + 1;
      } while (lVar33 != lVar28);
    }
  }
  pTVar23 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (local_108,(Type *)0x0);
  local_148._0_8_ = local_148 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_148,"softmax","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar23->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_148);
  uVar13 = local_14c;
  if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
    operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(pTVar23,"intermediateOutput");
  CoreML::Specification::NeuralNetworkLayer::add_output(pTVar23,"scoreVector");
  if (pTVar23->_oneof_case_[0] != 0xaf) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(pTVar23);
    pTVar23->_oneof_case_[0] = 0xaf;
    this_02 = (SoftmaxLayerParams *)operator_new(0x18);
    CoreML::Specification::SoftmaxLayerParams::SoftmaxLayerParams(this_02);
    (pTVar23->layer_).softmax_ = this_02;
  }
  pCVar8 = local_1a0;
  if ((char)uVar13 != '\0') {
    pMVar12->isupdatable_ = true;
    local_110->isupdatable_ = true;
    lVar31._0_4_ = (local_1a0->kernelsize_).current_size_;
    lVar31._4_4_ = (local_1a0->kernelsize_).total_size_;
    if (lVar31 == 0) {
      pWVar24 = (WeightParams *)operator_new(0x50);
      CoreML::Specification::WeightParams::WeightParams(pWVar24);
      *(WeightParams **)&pCVar8->kernelsize_ = pWVar24;
    }
    *(undefined1 *)(*(long *)&pCVar8->kernelsize_ + 0x48) = 1;
    if ((char)local_194 != '\0') {
      if ((pCVar8->kernelsize_).rep_ == (Rep *)0x0) {
        pWVar24 = (WeightParams *)operator_new(0x50);
        CoreML::Specification::WeightParams::WeightParams(pWVar24);
        (pCVar8->kernelsize_).rep_ = (Rep *)pWVar24;
      }
      *(undefined1 *)(pCVar8->kernelsize_).rep_[4].elements = 1;
    }
    addCategoricalCrossEntropyLoss<CoreML::Specification::NeuralNetworkClassifier>
              (pMVar12,pNVar22,"cross_entropy_loss","scoreVector","target");
    addLearningRate<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar22,kSgdOptimizer,0.699999988079071,0.0,1.0);
    local_148._16_8_ = (undefined8 *)0x40;
    local_148._24_8_ = 0x80;
    local_148._0_8_ = (pointer)0x10;
    local_148._8_8_ = (void *)0x20;
    __l._M_len = 4;
    __l._M_array = (iterator)local_148;
    std::set<long,_std::less<long>,_std::allocator<long>_>::set
              ((set<long,_std::less<long>,_std::allocator<long>_> *)&local_98,__l,&local_1a1,
               &local_1a2);
    addMiniBatchSize<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar22,kSgdOptimizer,0x20,1,100,
               (set<long,_std::less<long>,_std::allocator<long>_> *)&local_98);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_98);
    local_c8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_c8._M_impl.super__Rb_tree_header._M_header;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_c8._M_impl._0_8_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_c8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_c8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_c8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_c8._M_impl.super__Rb_tree_header._M_header._M_left;
    addEpochs<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar22,100,1,100,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_c8);
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_c8);
    local_f8._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_f8._M_impl.super__Rb_tree_header._M_header;
    local_f8._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_f8._M_impl._0_8_ = 0;
    local_f8._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_f8._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
    local_f8._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_f8._M_impl.super__Rb_tree_header._M_header._M_right =
         local_f8._M_impl.super__Rb_tree_header._M_header._M_left;
    addShuffleAndSeed<CoreML::Specification::NeuralNetworkClassifier>
              (pNVar22,0x7e3,0,0x7e3,(set<long,_std::less<long>,_std::allocator<long>_> *)&local_f8)
    ;
    std::_Rb_tree<long,_long,_std::_Identity<long>,_std::less<long>,_std::allocator<long>_>::
    ~_Rb_tree(&local_f8);
    if (pMVar12->description_ == (ModelDescription *)0x0) {
      pMVar16 = (ModelDescription *)operator_new(0x78);
      CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
      pMVar12->description_ = pMVar16;
    }
    google::protobuf::internal::RepeatedPtrFieldBase::
    Clear<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
              (&(pMVar12->description_->traininginput_).super_RepeatedPtrFieldBase);
    pMVar16 = pMVar12->description_;
    if (pMVar16 == (ModelDescription *)0x0) {
      pMVar16 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar10 = (pMVar16->input_).super_RepeatedPtrFieldBase.rep_;
    ppvVar29 = pRVar10->elements;
    if (pRVar10 == (Rep *)0x0) {
      ppvVar29 = (void **)0x0;
    }
    lVar31 = (long)(pMVar16->input_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar31 != 0) {
      lVar33 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_148,*(FeatureDescription **)((long)ppvVar29 + lVar33)
                  );
        if (pMVar12->description_ == (ModelDescription *)0x0) {
          pMVar16 = (ModelDescription *)operator_new(0x78);
          CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
          pMVar12->description_ = pMVar16;
        }
        pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                  Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                            (&(pMVar12->description_->traininginput_).super_RepeatedPtrFieldBase,
                             (Type *)0x0);
        CoreML::Specification::FeatureDescription::CopyFrom(pTVar17,(FeatureDescription *)local_148)
        ;
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_148);
        lVar33 = lVar33 + 8;
      } while (lVar31 * 8 != lVar33);
    }
    pMVar16 = pMVar12->description_;
    if (pMVar16 == (ModelDescription *)0x0) {
      pMVar16 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
    }
    pRVar10 = (pMVar16->output_).super_RepeatedPtrFieldBase.rep_;
    ppvVar29 = pRVar10->elements;
    if (pRVar10 == (Rep *)0x0) {
      ppvVar29 = (void **)0x0;
    }
    lVar31 = (long)(pMVar16->output_).super_RepeatedPtrFieldBase.current_size_;
    if (lVar31 != 0) {
      lVar33 = 0;
      do {
        CoreML::Specification::FeatureDescription::FeatureDescription
                  ((FeatureDescription *)local_148,*(FeatureDescription **)((long)ppvVar29 + lVar33)
                  );
        pMVar16 = pMVar12->description_;
        pMVar27 = pMVar16;
        if (pMVar16 == (ModelDescription *)0x0) {
          pMVar27 = (ModelDescription *)&CoreML::Specification::_ModelDescription_default_instance_;
        }
        psVar11 = (pMVar27->predictedfeaturename_).ptr_;
        __n = *(size_t *)(local_148._16_8_ + 8);
        if (__n == psVar11->_M_string_length) {
          if (__n != 0) {
            iVar15 = bcmp(*(void **)local_148._16_8_,(psVar11->_M_dataplus)._M_p,__n);
            if (iVar15 != 0) goto LAB_001d739a;
          }
          if (pMVar16 == (ModelDescription *)0x0) {
            pMVar16 = (ModelDescription *)operator_new(0x78);
            CoreML::Specification::ModelDescription::ModelDescription(pMVar16);
            pMVar12->description_ = pMVar16;
          }
          pTVar17 = google::protobuf::internal::RepeatedPtrFieldBase::
                    Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                              (&(pMVar12->description_->traininginput_).super_RepeatedPtrFieldBase,
                               (Type *)0x0);
          CoreML::Specification::FeatureDescription::CopyFrom
                    (pTVar17,(FeatureDescription *)local_148);
        }
LAB_001d739a:
        CoreML::Specification::FeatureDescription::~FeatureDescription
                  ((FeatureDescription *)local_148);
        lVar33 = lVar33 + 8;
      } while (lVar31 * 8 != lVar33);
    }
  }
  return pNVar22;
}

Assistant:

Specification::NeuralNetworkClassifier* buildBasicNeuralNetworkClassifierModel(Specification::Model& m, bool isUpdatable, const TensorAttributes *inTensorAttr, std::vector<std::string> stringClassLabels, std::vector<int64_t> intClassLabels, bool includeBias) {
    
    bool usesStringClassLabels = stringClassLabels.size() > 0;
    
    auto input = m.mutable_description()->add_input();
    auto inputType = new Specification::FeatureType;
    auto multiArray = inputType->mutable_multiarraytype();
    multiArray->mutable_shape()->Add(inTensorAttr->dimension);
    multiArray->set_datatype(::CoreML::Specification::ArrayFeatureType_ArrayDataType_DOUBLE);
    input->set_name(inTensorAttr->name);
    input->set_allocated_type(inputType);
    
    auto output = m.mutable_description()->add_output();
    auto outputType = new Specification::FeatureType;
    if (usesStringClassLabels) {
        outputType->mutable_stringtype();
    } else {
        outputType->mutable_int64type();
    }
    
    output->set_name("predictedClass");
    output->set_allocated_type(outputType);
    
    output = m.mutable_description()->add_output();
    outputType = new Specification::FeatureType;
    auto dictionary = outputType->mutable_dictionarytype();
    if (usesStringClassLabels) {
        dictionary->mutable_stringkeytype();
    } else {
        dictionary->mutable_int64keytype();
    }
    
    output->set_name("classProbabilities");
    output->set_allocated_type(outputType);

    m.mutable_description()->set_predictedfeaturename("predictedClass");
    m.mutable_description()->set_predictedprobabilitiesname("classProbabilities");
    
    auto classifier = m.mutable_neuralnetworkclassifier();
    
    if (usesStringClassLabels) {
        for (auto className : stringClassLabels) {
            classifier->mutable_stringclasslabels()->add_vector(className);
        }
    } else {
        for (auto className : intClassLabels) {
            classifier->mutable_int64classlabels()->add_vector(className);
        }
    }
    
    // Add inner product layer
    auto innerProductLayer = classifier->add_layers();
    innerProductLayer->set_name("inner_product");
    innerProductLayer->add_input(inTensorAttr->name);
    innerProductLayer->add_output("intermediateOutput");
    
    uint64_t C_in = (uint64_t)inTensorAttr->dimension;
    uint64_t C_out = 0;
    
    if (usesStringClassLabels) {
        C_out = (uint64_t)stringClassLabels.size();
    } else {
        C_out = (uint64_t)intClassLabels.size();
    }
    
    auto innerProductParams = innerProductLayer->mutable_innerproduct();
    innerProductParams->set_inputchannels(C_in);
    innerProductParams->set_outputchannels(C_out);
    
    ::google::protobuf::RepeatedField<float>* weightsWrite = innerProductParams->mutable_weights()->mutable_floatvalue();
    weightsWrite->Resize((int)C_in * (int)C_out, 0.0);
    float *destination_weights = weightsWrite->mutable_data();
    for (uint64_t i = 0; i < C_in; i++) {
        for (uint64_t j = 0; j < C_out; j++) {
            float random = float(rand())/float(RAND_MAX);
            destination_weights[i * C_out + j] = random;
        }
    }
    
    if (includeBias) {
        innerProductParams->set_hasbias(true);
        
        ::google::protobuf::RepeatedField<float>* biasWrite = innerProductParams->mutable_bias()->mutable_floatvalue();
        biasWrite->Resize((int)1 * (int)C_out, 0.0);
        float *destination_bias = biasWrite->mutable_data();
        for (uint64_t i = 0; i < 1; i++) {
            for (uint64_t j = 0; j < C_out; j++) {
                float random = float(rand())/float(RAND_MAX);
                destination_bias[i * C_out + j] = random;
            }
        }
    }
    
    // Add inner product layer
    auto softmaxLayer = classifier->add_layers();
    softmaxLayer->set_name("softmax");
    softmaxLayer->add_input("intermediateOutput");
    softmaxLayer->add_output("scoreVector");
    softmaxLayer->mutable_softmax();
    
    if (isUpdatable) {
        m.set_isupdatable(true);
        innerProductLayer->set_isupdatable(true);
        innerProductParams->mutable_weights()->set_isupdatable(true);
        
        if (includeBias) {
            innerProductParams->mutable_bias()->set_isupdatable(true);
        }
        
        addCategoricalCrossEntropyLoss(m, classifier, "cross_entropy_loss", "scoreVector", "target");
        
        addLearningRate(classifier, Specification::Optimizer::kSgdOptimizer, 0.7f, 0.0f, 1.0f);
        addMiniBatchSize(classifier, Specification::Optimizer::kSgdOptimizer, 32, 1, 100, {16, 32, 64, 128});
        addEpochs(classifier, 100, 1, 100, std::set<int64_t>());
        addShuffleAndSeed(classifier, 2019, 0, 2019, std::set<int64_t>());

        m.mutable_description()->clear_traininginput();
        
        for (auto feature : m.description().input()) {
            auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
            trainingInput->CopyFrom(feature);
        }
        for (auto feature : m.description().output()) {
            if (feature.name() == m.description().predictedfeaturename()) {
                auto trainingInput = m.mutable_description()->mutable_traininginput()->Add();
                trainingInput->CopyFrom(feature);
            }
        }
    }
    
    return classifier;
}